

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v10::detail::fwrite_fully(void *ptr,size_t count,FILE *stream)

{
  uint uVar1;
  undefined8 uVar2;
  uint *puVar3;
  format_string<> fmt;
  basic_string_view<char> bVar4;
  anon_class_1_0_00000001 local_4a;
  v10 local_49;
  char *local_48 [2];
  FILE *local_38;
  size_t written;
  FILE *stream_local;
  size_t count_local;
  void *ptr_local;
  char **local_10;
  
  written = (size_t)stream;
  stream_local = (FILE *)count;
  count_local = (size_t)ptr;
  local_38 = (FILE *)fwrite(ptr,1,count,(FILE *)stream);
  if (local_38 < stream_local) {
    uVar2 = __cxa_allocate_exception(0x20);
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    fwrite_fully::anon_class_1_0_00000001::operator()(&local_4a);
    local_10 = local_48;
    ptr_local = &local_49;
    bVar4 = v10::operator()((v10 *)ptr_local);
    local_48[0] = bVar4.data_;
    check_format_string<FMT_COMPILE_STRING,_0>();
    fmt.str_.data_ = (char *)(ulong)uVar1;
    fmt.str_.size_ = (size_t)local_48[0];
    system_error<>((int)uVar2,fmt);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

inline void fwrite_fully(const void* ptr, size_t count, FILE* stream) {
  size_t written = std::fwrite(ptr, 1, count, stream);
  if (written < count)
    FMT_THROW(system_error(errno, FMT_STRING("cannot write to file")));
}